

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

void __thiscall
wasm::LocalGraphFlower::flowBackFromStartOfBlock
          (LocalGraphFlower *this,FlowBlock *block,Index index,
          vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *gets)

{
  FlowBlock *pFVar1;
  pointer ppLVar2;
  __normal_iterator<std::pair<unsigned_int,_wasm::LocalSet_*>_*,_std::vector<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>_>
  _Var3;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *pSVar4;
  pointer ppLVar5;
  iterator __begin4;
  FlowBlock *pFVar6;
  FlowBlock *local_78;
  FlowBlock *block_local;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *local_68;
  vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *__range6;
  LocalSet *pLStack_58;
  Index index_local;
  LocalGet *get;
  FlowBlock *pred;
  vector<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  work;
  
  pred = (FlowBlock *)0x0;
  work.
  super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  work.
  super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = block;
  local_68 = gets;
  __range6._4_4_ = index;
  std::vector<wasm::LocalGraphFlower::FlowBlock*,std::allocator<wasm::LocalGraphFlower::FlowBlock*>>
  ::_M_realloc_insert<wasm::LocalGraphFlower::FlowBlock*const&>
            ((vector<wasm::LocalGraphFlower::FlowBlock*,std::allocator<wasm::LocalGraphFlower::FlowBlock*>>
              *)&pred,(iterator)0x0,&local_78);
  while (pred != (FlowBlock *)
                 work.
                 super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
    pFVar1 = work.
             super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start[-1];
    work.
    super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         work.
         super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
         ._M_impl.super__Vector_impl_data._M_start + -1;
    pFVar6 = (FlowBlock *)
             (pFVar1->in).
             super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    block_local = (FlowBlock *)
                  (pFVar1->in).
                  super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    if (pFVar6 == block_local) {
      if (pFVar1 == this->entryFlowBlock) {
        ppLVar2 = (local_68->super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppLVar5 = (local_68->
                       super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                       _M_impl.super__Vector_impl_data._M_start; ppLVar5 != ppLVar2;
            ppLVar5 = ppLVar5 + 1) {
          get = *ppLVar5;
          pSVar4 = &std::__detail::
                    _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this->getSetsMap,&get)->
                    super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ;
          pLStack_58 = (LocalSet *)0x0;
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::insert(pSVar4,&stack0xffffffffffffffa8);
        }
      }
    }
    else {
      do {
        get = (LocalGet *)pFVar6->lastTraversedIteration;
        if (((FlowBlock *)get)->lastTraversedIteration != this->currentIteration) {
          ((FlowBlock *)get)->lastTraversedIteration = this->currentIteration;
          _Var3 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,wasm::LocalSet*>*,std::vector<std::pair<unsigned_int,wasm::LocalSet*>,std::allocator<std::pair<unsigned_int,wasm::LocalSet*>>>>,__gnu_cxx::__ops::_Iter_pred<wasm::LocalGraphFlower::flowBackFromStartOfBlock(wasm::LocalGraphFlower::FlowBlock*,unsigned_int,std::vector<wasm::LocalGet*,std::allocator<wasm::LocalGet*>>const&)::_lambda(std::pair<unsigned_int,wasm::LocalSet*>&)_1_>>
                            ((((FlowBlock *)get)->lastSets).
                             super__Vector_base<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (((FlowBlock *)get)->lastSets).
                             super__Vector_base<std::pair<unsigned_int,_wasm::LocalSet_*>,_std::allocator<std::pair<unsigned_int,_wasm::LocalSet_*>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(long)&__range6 + 4);
          if (_Var3._M_current == *(pair<unsigned_int,_wasm::LocalSet_*> **)&get[2].index) {
            if (work.
                super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                work.
                super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::
              vector<wasm::LocalGraphFlower::FlowBlock*,std::allocator<wasm::LocalGraphFlower::FlowBlock*>>
              ::_M_realloc_insert<wasm::LocalGraphFlower::FlowBlock*const&>
                        ((vector<wasm::LocalGraphFlower::FlowBlock*,std::allocator<wasm::LocalGraphFlower::FlowBlock*>>
                          *)&pred,(iterator)
                                  work.
                                  super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start,(FlowBlock **)&get);
            }
            else {
              *work.
               super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start = (FlowBlock *)get;
              work.
              super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   work.
                   super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
          }
          else {
            ppLVar5 = (local_68->
                      super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            ppLVar2 = (local_68->
                      super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            if (ppLVar5 != ppLVar2) {
              do {
                pLStack_58 = (LocalSet *)*ppLVar5;
                pSVar4 = &std::__detail::
                          _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                        *)this->getSetsMap,(key_type *)&stack0xffffffffffffffa8)->
                          super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ;
                SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                ::insert(pSVar4,&(_Var3._M_current)->second);
                ppLVar5 = ppLVar5 + 1;
              } while (ppLVar5 != ppLVar2);
            }
          }
        }
        pFVar6 = (FlowBlock *)&pFVar6->actions;
      } while (pFVar6 != block_local);
    }
  }
  this->currentIteration = this->currentIteration + 1;
  if (pred != (FlowBlock *)0x0) {
    operator_delete(pred,(long)work.
                               super__Vector_base<wasm::LocalGraphFlower::FlowBlock_*,_std::allocator<wasm::LocalGraphFlower::FlowBlock_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pred);
  }
  return;
}

Assistant:

void flowBackFromStartOfBlock(FlowBlock* block,
                                Index index,
                                const std::vector<LocalGet*>& gets) {
    std::vector<FlowBlock*> work; // TODO: UniqueDeferredQueue
    work.push_back(block);
    // Note that we may need to revisit the later parts of this initial
    // block, if we are in a loop, so don't mark it as seen.
    while (!work.empty()) {
      auto* curr = work.back();
      work.pop_back();
      // We have gone through this block; now we must handle flowing to
      // the inputs.
      if (curr->in.empty()) {
        if (curr == entryFlowBlock) {
          // These receive a param or zero init value.
          for (auto* get : gets) {
            getSetsMap[get].insert(nullptr);
          }
        }
      } else {
        for (auto* pred : curr->in) {
          if (pred->lastTraversedIteration == currentIteration) {
            // We've already seen pred in this iteration.
            continue;
          }
          pred->lastTraversedIteration = currentIteration;
          auto lastSet = std::find_if(pred->lastSets.begin(),
                                      pred->lastSets.end(),
                                      [&](std::pair<Index, LocalSet*>& value) {
                                        return value.first == index;
                                      });
          if (lastSet != pred->lastSets.end()) {
            // There is a set here, apply it, and stop the flow.
            // TODO: If we find a computed get, apply its sets and stop? That
            //       could help but it requires more info on FlowBlock.
            for (auto* get : gets) {
              getSetsMap[get].insert(lastSet->second);
            }
          } else {
            // Keep on flowing.
            work.push_back(pred);
          }
        }
      }
    }

    // Bump the current iteration for the next time we are called.
    currentIteration++;
  }